

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O2

hugeint_t duckdb::AddOperatorOverflowCheck::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t left,hugeint_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  uint64_t uVar2;
  PhysicalType type;
  hugeint_t value;
  hugeint_t value_00;
  allocator local_c1;
  hugeint_t result;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar2 = right.upper;
  bVar1 = TryAddOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Overflow in addition of %s (%s + %s)!",&local_c1);
  TypeIdToString_abi_cxx11_(&local_70,(duckdb *)0xcc,type);
  value.upper = uVar2;
  value.lower = left.upper;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_90,(NumericHelper *)left.lower,value);
  value_00.upper = uVar2;
  value_00.lower = right.upper;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_b0,(NumericHelper *)right.lower,value_00);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_50,&local_70,&local_90,&local_b0);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}